

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O0

string * showVector_abi_cxx11_(vector<int,_std::allocator<int>_> *v)

{
  size_type sVar1;
  const_reference pvVar2;
  vector<int,_std::allocator<int>_> *in_RSI;
  string *in_RDI;
  uint i;
  stringstream ss;
  uint local_19c;
  stringstream local_198 [16];
  ostream local_188 [376];
  vector<int,_std::allocator<int>_> *local_10;
  
  local_10 = in_RSI;
  std::__cxx11::stringstream::stringstream(local_198);
  local_19c = 0;
  while( true ) {
    sVar1 = std::vector<int,_std::allocator<int>_>::size(local_10);
    if (sVar1 <= local_19c) break;
    if (local_19c != 0) {
      std::operator<<(local_188," ");
    }
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](local_10,(ulong)local_19c);
    std::ostream::operator<<(local_188,*pvVar2);
    local_19c = local_19c + 1;
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

std::string showVector(const std::vector<int>& v) {
	std::stringstream ss;
	for (unsigned int i = 0; i < v.size(); i++) {
		if (i > 0) {
			ss << " ";
		}
		ss << v[i];
	}
	return ss.str();
}